

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thinlenscamera.hpp
# Opt level: O1

void __thiscall ThinlensCamera::ThinlensCamera(ThinlensCamera *this,Json *conf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ulong uVar7;
  int iVar14;
  int iVar15;
  double dVar16;
  const_reference pvVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float ret;
  float ret_1;
  float local_20;
  float local_1c;
  
  Camera::Camera(&this->super_Camera,conf);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR_sampleray_0016cd10;
  *(undefined8 *)&(this->super_Camera).field_0x3c = 0;
  *(undefined8 *)&this->field_0x44 = 0;
  (this->uphalf).y = 0.0;
  (this->uphalf).z = 0.0;
  (this->lefthalf).x = 0.0;
  (this->lefthalf).y = 0.0;
  (this->lefthalf).z = 0.0;
  pvVar17 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"focaldistance");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar17,&local_20);
  this->focaldistance = local_20;
  pvVar17 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"lensradius");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar17,&local_1c);
  this->lensradius = local_1c;
  fVar20 = (this->super_Camera).look_at.z - (this->super_Camera).position.z;
  uVar1 = (this->super_Camera).position.x;
  uVar8 = (this->super_Camera).position.y;
  uVar2 = (this->super_Camera).look_at.x;
  uVar9 = (this->super_Camera).look_at.y;
  fVar22 = (float)uVar2 - (float)uVar1;
  fVar23 = (float)uVar9 - (float)uVar8;
  fVar18 = fVar20 * fVar20 + fVar22 * fVar22 + fVar23 * fVar23;
  if (fVar18 < 0.0) {
    fVar18 = sqrtf(fVar18);
  }
  else {
    fVar18 = SQRT(fVar18);
  }
  fVar18 = 1.0 / fVar18;
  fVar20 = fVar20 * fVar18;
  fVar22 = fVar22 * fVar18;
  fVar23 = fVar23 * fVar18;
  *(ulong *)&(this->super_Camera).field_0x3c = CONCAT44(fVar23,fVar22);
  *(float *)&this->field_0x44 = fVar20;
  uVar3 = (this->super_Camera).up.x;
  uVar10 = (this->super_Camera).up.y;
  uVar4 = (this->super_Camera).up.y;
  uVar11 = (this->super_Camera).up.z;
  fVar24 = (this->super_Camera).up.z * fVar22 - fVar20 * (float)uVar3;
  fVar18 = (float)uVar3 * fVar23 - (float)uVar4 * fVar22;
  fVar19 = (float)uVar10 * fVar20 - (float)uVar11 * fVar23;
  fVar21 = fVar23 * fVar18 - fVar24 * fVar20;
  fVar20 = fVar20 * fVar19 - fVar18 * fVar22;
  fVar22 = fVar24 * fVar22 - fVar19 * fVar23;
  fVar18 = fVar22 * fVar22 + fVar21 * fVar21 + fVar20 * fVar20;
  if (fVar18 < 0.0) {
    fVar18 = sqrtf(fVar18);
  }
  else {
    fVar18 = SQRT(fVar18);
  }
  fVar18 = 1.0 / fVar18;
  (this->super_Camera).up.x = fVar18 * fVar21;
  (this->super_Camera).up.y = fVar18 * fVar20;
  (this->super_Camera).up.z = fVar18 * fVar22;
  fVar18 = *(float *)&(this->super_Camera).field_0x3c;
  fVar18 = *(float *)&this->field_0x44 * *(float *)&this->field_0x44 +
           fVar18 * fVar18 + *(float *)&this->field_0x40 * *(float *)&this->field_0x40;
  if (fVar18 < 0.0) {
    fVar18 = sqrtf(fVar18);
  }
  else {
    fVar18 = SQRT(fVar18);
  }
  iVar14 = (this->super_Camera).resy;
  iVar15 = (this->super_Camera).resx;
  dVar16 = tan((double)((this->super_Camera).fov * 0.5));
  fVar20 = (float)(dVar16 * (double)(((float)iVar14 * fVar18) / (float)iVar15));
  uVar5 = (this->super_Camera).up.x;
  uVar12 = (this->super_Camera).up.y;
  uVar6 = (this->super_Camera).up.y;
  uVar13 = (this->super_Camera).up.z;
  fVar18 = (this->super_Camera).up.z;
  (this->uphalf).x = fVar20 * (float)uVar5;
  (this->uphalf).y = fVar20 * (float)uVar12;
  (this->uphalf).z = fVar20 * fVar18;
  fVar20 = *(float *)&(this->super_Camera).field_0x3c;
  fVar23 = (float)*(undefined8 *)&this->field_0x40;
  fVar19 = (float)((ulong)*(undefined8 *)&this->field_0x40 >> 0x20);
  dVar16 = tan((double)((this->super_Camera).fov * 0.5));
  fVar22 = (float)dVar16;
  (this->lefthalf).x = fVar22 * (fVar19 * (float)uVar6 - fVar18 * fVar23);
  (this->lefthalf).y = fVar22 * (fVar20 * (float)uVar13 - (float)uVar5 * fVar19);
  (this->lefthalf).z = ((float)uVar5 * fVar23 - (float)uVar12 * fVar20) * fVar22;
  if ((this->super_Camera).mirror == true) {
    uVar7._0_4_ = (this->lefthalf).x;
    uVar7._4_4_ = (this->lefthalf).y;
    (this->lefthalf).x = (float)(int)(uVar7 ^ 0x8000000080000000);
    (this->lefthalf).y = (float)(int)((uVar7 ^ 0x8000000080000000) >> 0x20);
    (this->lefthalf).z = -(this->lefthalf).z;
  }
  return;
}

Assistant:

ThinlensCamera(const Json& conf): Camera(conf) {
		focaldistance = conf["focaldistance"];
		lensradius = conf["lensradius"];
		dir = normalized(look_at - position);
		up = normalized(cross(dir, cross(up, dir)));
		uphalf = norm(dir) * resy / resx * tan(fov/2) * up;
		lefthalf = cross(up, dir) * tan(fov/2);
		if (mirror) lefthalf = -lefthalf;
	}